

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFHelper.h
# Opt level: O0

void __thiscall Assimp::DXF::LineReader::LineReader(LineReader *this,StreamReaderLE *reader)

{
  StreamReaderLE *reader_local;
  LineReader *this_local;
  
  LineSplitter::LineSplitter(&this->splitter,reader,false,true);
  this->groupcode = 0;
  std::__cxx11::string::string((string *)&this->value);
  this->end = 0;
  return;
}

Assistant:

LineReader(StreamReaderLE& reader)
    : splitter(reader,false,true)
    , groupcode( 0 )
    , value()
    , end() {
        // empty
    }